

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_UnaryExprPrecedence_Test::TestBody(ExprWriterTest_UnaryExprPrecedence_Test *this)

{
  Reference other;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  other_00;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  other_01;
  Reference other_02;
  Reference other_03;
  NumericExpr rhs;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  other_04;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  other_05;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  ExprBase arg;
  CStringRef in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Reference x1;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffe78;
  Kind kind;
  undefined4 in_stack_fffffffffffffe80;
  Kind in_stack_fffffffffffffe84;
  undefined4 uVar4;
  ExprBase in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 uVar5;
  ExprBase in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  string *file;
  undefined8 in_stack_fffffffffffffea8;
  Type type;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> this_00;
  char local_d8 [8];
  BasicCStringRef<char> local_d0;
  string local_c8 [32];
  AssertionResult local_a8 [3];
  ExprBase local_78;
  BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24> local_68;
  BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24> local_58;
  BasicCStringRef<char> local_48;
  string local_40 [32];
  AssertionResult local_20;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_10.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_fffffffffffffe78,0);
  kind = (Kind)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"{}");
  local_78.impl_ = (Impl *)local_10.super_ExprBase.impl_;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffe94;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe88.impl_,
             other,in_stack_fffffffffffffe84);
  local_68.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeUnary
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),kind,
                  (NumericExpr)in_stack_fffffffffffffe88.impl_);
  other_00.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffe94;
  other_00.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe88.impl_,
             other_00,in_stack_fffffffffffffe84);
  local_58.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeUnary
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),kind,
                  (NumericExpr)in_stack_fffffffffffffe88.impl_);
  other_01.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffe94;
  other_01.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe88.impl_,
             other_01,in_stack_fffffffffffffe84);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_RDI,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                    CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe98.impl_,
             (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (char (*) [5])in_stack_fffffffffffffe88.impl_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::__cxx11::string::~string(local_40);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffeb0));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x11fd8f);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),type,
               in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x11fdec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fe44);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_d0,"{}");
  arg.impl_ = (Impl *)(in_RDI.data_ + 0x10);
  uVar5 = 0;
  other_02.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = 0;
  other_02.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  this_00.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)arg.impl_,other_02,
             in_stack_fffffffffffffe84);
  other_03.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = uVar5;
  other_03.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)arg.impl_,other_03,
             in_stack_fffffffffffffe84);
  rhs.super_ExprBase.impl_._4_4_ = uVar5;
  rhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe90;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
            ((BasicExprFactory<std::allocator<char>_> *)arg.impl_,in_stack_fffffffffffffe84,
             (NumericExpr)in_stack_fffffffffffffe98.impl_,rhs);
  other_04.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_._4_4_ =
       uVar5;
  other_04.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)arg.impl_,other_04,
             in_stack_fffffffffffffe84);
  mp::BasicExprFactory<std::allocator<char>_>::MakeUnary
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),kind,
             (NumericExpr)arg.impl_);
  pcVar3 = local_d8;
  other_05.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._4_4_ = uVar5
  ;
  other_05.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffe90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)arg.impl_,other_05,
             in_stack_fffffffffffffe84);
  file = local_c8;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_RDI,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                    CONCAT17(uVar1,in_stack_fffffffffffffeb0));
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (pcVar3,(char *)CONCAT44(uVar5,in_stack_fffffffffffffe90),(char (*) [11])arg.impl_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  line = (int)((ulong)pcVar3 >> 0x20);
  std::__cxx11::string::~string(local_c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe84);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffeb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x120012);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),type,(char *)file,line,
               (char *)CONCAT44(uVar5,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.super_ExprBase.impl_,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x12005e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1200ad);
  return;
}

Assistant:

TEST_F(ExprWriterTest, UnaryExprPrecedence) {
  auto x1 = MakeVariable(0);
  CHECK_WRITE("--x1", MakeUnary(ex::MINUS, MakeUnary(ex::MINUS, x1)));
  CHECK_WRITE("-(x1 ^ x1)", MakeUnary(ex::MINUS, MakeBinary(ex::POW, x1, x1)));
}